

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O0

void get_msurf_descriptor_precompute_gauss_array(integral_image *iimage,interest_point *ipoint)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  float *in_RSI;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  int i_1;
  float norm_factor;
  float d4;
  float d3;
  float d2;
  float d1;
  float gauss_s2;
  float rry;
  float rrx;
  float ry;
  float rx;
  float gauss_s1;
  float gauss_s1_x;
  int sample_x_sub_int_scale;
  int sample_x;
  int k;
  int gauss_index_k;
  float gauss_s1_y;
  int sample_y_sub_int_scale;
  int sample_y;
  int l;
  int gauss_index_l_inc;
  int gauss_index_l;
  float mdy;
  float mdx;
  float dy;
  float dx;
  float *j_arr;
  int j;
  int gauss_index_k_inc;
  int gauss_index_k_start;
  float *i_arr;
  int i;
  float e_c1_p4;
  float e_c1_p3;
  float e_c1_p2;
  float e_c1_p1;
  float e_c1_m1;
  float e_c1_m2;
  float e_c1_m3;
  float e_c1_m4;
  float e_c0_p4;
  float e_c0_p3;
  float e_c0_p2;
  float e_c0_p1;
  float e_c0_m1;
  float e_c0_m2;
  float e_c0_m3;
  float e_c0_m4;
  float s11;
  float s10;
  float s9;
  float s8;
  float s7;
  float s6;
  float s5;
  float s4;
  float s3;
  float s2;
  float s1;
  float s0;
  int gauss_s2_index;
  float sum_of_squares;
  int desc_idx;
  float *descriptor;
  float ipoint_y;
  float ipoint_x;
  float g1_factor;
  float scale_squared;
  int int_scale;
  float scale;
  int local_13c;
  int local_100;
  int local_fc;
  float local_e0;
  float fVar76;
  float fVar77;
  float fVar78;
  float *iimage_00;
  int local_c4;
  float *local_b8;
  int local_b0;
  int local_3c;
  float local_38;
  int local_34;
  
  fVar31 = in_RSI[2];
  auVar59._8_4_ = 0x80000000;
  auVar59._0_8_ = 0x8000000080000000;
  auVar59._12_4_ = 0x80000000;
  auVar37._8_4_ = 0x3effffff;
  auVar37._0_8_ = 0x3effffff3effffff;
  auVar37._12_4_ = 0x3effffff;
  auVar18 = vpternlogd_avx512vl(auVar37,ZEXT416((uint)fVar31),auVar59,0xf8);
  vroundss_avx(ZEXT416((uint)fVar31),ZEXT416((uint)(fVar31 + auVar18._0_4_)),0xb);
  fVar28 = -0.08 / (fVar31 * fVar31);
  fVar78 = *in_RSI;
  auVar60._8_4_ = 0x80000000;
  auVar60._0_8_ = 0x8000000080000000;
  auVar60._12_4_ = 0x80000000;
  auVar38._8_4_ = 0x3effffff;
  auVar38._0_8_ = 0x3effffff3effffff;
  auVar38._12_4_ = 0x3effffff;
  auVar18 = vpternlogd_avx512vl(auVar38,ZEXT416((uint)fVar78),auVar60,0xf8);
  auVar18 = vroundss_avx(ZEXT416((uint)fVar78),ZEXT416((uint)(fVar78 + auVar18._0_4_)),0xb);
  auVar57._0_8_ = (double)auVar18._0_4_;
  auVar57._8_8_ = 0;
  auVar18._0_8_ = (double)fVar31;
  auVar18._8_8_ = 0;
  auVar37 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar18,auVar57);
  fVar78 = in_RSI[1];
  auVar61._8_4_ = 0x80000000;
  auVar61._0_8_ = 0x8000000080000000;
  auVar61._12_4_ = 0x80000000;
  auVar39._8_4_ = 0x3effffff;
  auVar39._0_8_ = 0x3effffff3effffff;
  auVar39._12_4_ = 0x3effffff;
  auVar18 = vpternlogd_avx512vl(auVar39,ZEXT416((uint)fVar78),auVar61,0xf8);
  auVar18 = vroundss_avx(ZEXT416((uint)fVar78),ZEXT416((uint)(fVar78 + auVar18._0_4_)),0xb);
  auVar58._0_8_ = (double)auVar18._0_4_;
  auVar58._8_8_ = 0;
  auVar19._0_8_ = (double)fVar31;
  auVar19._8_8_ = 0;
  auVar38 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar19,auVar58);
  local_34 = 0;
  local_38 = 0.0;
  local_3c = 0;
  auVar20._4_12_ = SUB1612(ZEXT816(0x3fe0000000000000),4);
  auVar20._0_4_ = fVar31 * 0.5;
  auVar62._8_4_ = 0x80000000;
  auVar62._0_8_ = 0x8000000080000000;
  auVar62._12_4_ = 0x80000000;
  auVar40._8_4_ = 0x3effffff;
  auVar40._0_8_ = 0x3effffff3effffff;
  auVar40._12_4_ = 0x3effffff;
  auVar18 = vpternlogd_avx512vl(auVar40,auVar20,auVar62,0xf8);
  auVar18 = vroundss_avx(auVar20,ZEXT416((uint)(fVar31 * 0.5 + auVar18._0_4_)),0xb);
  auVar21._4_12_ = SUB1612(ZEXT816(0x3ff8000000000000),4);
  auVar21._0_4_ = fVar31 * 1.5;
  auVar63._8_4_ = 0x80000000;
  auVar63._0_8_ = 0x8000000080000000;
  auVar63._12_4_ = 0x80000000;
  auVar41._8_4_ = 0x3effffff;
  auVar41._0_8_ = 0x3effffff3effffff;
  auVar41._12_4_ = 0x3effffff;
  auVar19 = vpternlogd_avx512vl(auVar41,auVar21,auVar63,0xf8);
  auVar19 = vroundss_avx(auVar21,ZEXT416((uint)(fVar31 * 1.5 + auVar19._0_4_)),0xb);
  auVar22._4_12_ = SUB1612(ZEXT816(0x4004000000000000),4);
  auVar22._0_4_ = fVar31 * 2.5;
  auVar64._8_4_ = 0x80000000;
  auVar64._0_8_ = 0x8000000080000000;
  auVar64._12_4_ = 0x80000000;
  auVar42._8_4_ = 0x3effffff;
  auVar42._0_8_ = 0x3effffff3effffff;
  auVar42._12_4_ = 0x3effffff;
  auVar20 = vpternlogd_avx512vl(auVar42,auVar22,auVar64,0xf8);
  auVar20 = vroundss_avx(auVar22,ZEXT416((uint)(fVar31 * 2.5 + auVar20._0_4_)),0xb);
  fVar29 = auVar20._0_4_;
  auVar23._4_12_ = SUB1612(ZEXT816(0x400c000000000000),4);
  auVar23._0_4_ = fVar31 * 3.5;
  auVar65._8_4_ = 0x80000000;
  auVar65._0_8_ = 0x8000000080000000;
  auVar65._12_4_ = 0x80000000;
  auVar43._8_4_ = 0x3effffff;
  auVar43._0_8_ = 0x3effffff3effffff;
  auVar43._12_4_ = 0x3effffff;
  auVar20 = vpternlogd_avx512vl(auVar43,auVar23,auVar65,0xf8);
  auVar20 = vroundss_avx(auVar23,ZEXT416((uint)(fVar31 * 3.5 + auVar20._0_4_)),0xb);
  auVar24._4_12_ = SUB1612(ZEXT816(0x4012000000000000),4);
  auVar24._0_4_ = fVar31 * 4.5;
  auVar66._8_4_ = 0x80000000;
  auVar66._0_8_ = 0x8000000080000000;
  auVar66._12_4_ = 0x80000000;
  auVar44._8_4_ = 0x3effffff;
  auVar44._0_8_ = 0x3effffff3effffff;
  auVar44._12_4_ = 0x3effffff;
  auVar21 = vpternlogd_avx512vl(auVar44,auVar24,auVar66,0xf8);
  auVar21 = vroundss_avx(auVar24,ZEXT416((uint)(fVar31 * 4.5 + auVar21._0_4_)),0xb);
  auVar25._4_12_ = SUB1612(ZEXT816(0x4016000000000000),4);
  auVar25._0_4_ = fVar31 * 5.5;
  auVar67._8_4_ = 0x80000000;
  auVar67._0_8_ = 0x8000000080000000;
  auVar67._12_4_ = 0x80000000;
  auVar45._8_4_ = 0x3effffff;
  auVar45._0_8_ = 0x3effffff3effffff;
  auVar45._12_4_ = 0x3effffff;
  auVar22 = vpternlogd_avx512vl(auVar45,auVar25,auVar67,0xf8);
  auVar22 = vroundss_avx(auVar25,ZEXT416((uint)(fVar31 * 5.5 + auVar22._0_4_)),0xb);
  auVar26._4_12_ = SUB1612(ZEXT816(0x401a000000000000),4);
  auVar26._0_4_ = fVar31 * 6.5;
  auVar68._8_4_ = 0x80000000;
  auVar68._0_8_ = 0x8000000080000000;
  auVar68._12_4_ = 0x80000000;
  auVar46._8_4_ = 0x3effffff;
  auVar46._0_8_ = 0x3effffff3effffff;
  auVar46._12_4_ = 0x3effffff;
  auVar23 = vpternlogd_avx512vl(auVar46,auVar26,auVar68,0xf8);
  auVar23 = vroundss_avx(auVar26,ZEXT416((uint)(fVar31 * 6.5 + auVar23._0_4_)),0xb);
  auVar27._4_12_ = SUB1612(ZEXT816(0x401e000000000000),4);
  auVar27._0_4_ = fVar31 * 7.5;
  auVar69._8_4_ = 0x80000000;
  auVar69._0_8_ = 0x8000000080000000;
  auVar69._12_4_ = 0x80000000;
  auVar47._8_4_ = 0x3effffff;
  auVar47._0_8_ = 0x3effffff3effffff;
  auVar47._12_4_ = 0x3effffff;
  auVar24 = vpternlogd_avx512vl(auVar47,auVar27,auVar69,0xf8);
  auVar24 = vroundss_avx(auVar27,ZEXT416((uint)(fVar31 * 7.5 + auVar24._0_4_)),0xb);
  fVar30 = auVar24._0_4_;
  auVar32._4_12_ = SUB1612(ZEXT816(0x4021000000000000),4);
  auVar32._0_4_ = fVar31 * 8.5;
  auVar70._8_4_ = 0x80000000;
  auVar70._0_8_ = 0x8000000080000000;
  auVar70._12_4_ = 0x80000000;
  auVar48._8_4_ = 0x3effffff;
  auVar48._0_8_ = 0x3effffff3effffff;
  auVar48._12_4_ = 0x3effffff;
  auVar24 = vpternlogd_avx512vl(auVar48,auVar32,auVar70,0xf8);
  auVar24 = vroundss_avx(auVar32,ZEXT416((uint)(fVar31 * 8.5 + auVar24._0_4_)),0xb);
  auVar33._4_12_ = SUB1612(ZEXT816(0x4023000000000000),4);
  auVar33._0_4_ = fVar31 * 9.5;
  auVar71._8_4_ = 0x80000000;
  auVar71._0_8_ = 0x8000000080000000;
  auVar71._12_4_ = 0x80000000;
  auVar49._8_4_ = 0x3effffff;
  auVar49._0_8_ = 0x3effffff3effffff;
  auVar49._12_4_ = 0x3effffff;
  auVar25 = vpternlogd_avx512vl(auVar49,auVar33,auVar71,0xf8);
  auVar25 = vroundss_avx(auVar33,ZEXT416((uint)(fVar31 * 9.5 + auVar25._0_4_)),0xb);
  auVar34._4_12_ = SUB1612(ZEXT816(0x4025000000000000),4);
  auVar34._0_4_ = fVar31 * 10.5;
  auVar72._8_4_ = 0x80000000;
  auVar72._0_8_ = 0x8000000080000000;
  auVar72._12_4_ = 0x80000000;
  auVar50._8_4_ = 0x3effffff;
  auVar50._0_8_ = 0x3effffff3effffff;
  auVar50._12_4_ = 0x3effffff;
  auVar26 = vpternlogd_avx512vl(auVar50,auVar34,auVar72,0xf8);
  auVar26 = vroundss_avx(auVar34,ZEXT416((uint)(fVar31 * 10.5 + auVar26._0_4_)),0xb);
  auVar35._4_12_ = SUB1612(ZEXT816(0x4027000000000000),4);
  auVar35._0_4_ = fVar31 * 11.5;
  auVar73._8_4_ = 0x80000000;
  auVar73._0_8_ = 0x8000000080000000;
  auVar73._12_4_ = 0x80000000;
  auVar51._8_4_ = 0x3effffff;
  auVar51._0_8_ = 0x3effffff3effffff;
  auVar51._12_4_ = 0x3effffff;
  auVar27 = vpternlogd_avx512vl(auVar51,auVar35,auVar73,0xf8);
  auVar27 = vroundss_avx(auVar35,ZEXT416((uint)(fVar31 * 11.5 + auVar27._0_4_)),0xb);
  fVar78 = fVar29 + auVar19._0_4_;
  fVar77 = fVar29 + auVar18._0_4_;
  fVar76 = fVar29 - auVar18._0_4_;
  fVar1 = fVar29 - auVar19._0_4_;
  fVar2 = fVar29 - auVar20._0_4_;
  fVar3 = fVar29 - auVar21._0_4_;
  fVar4 = fVar29 - auVar22._0_4_;
  fVar29 = fVar29 - auVar23._0_4_;
  fVar5 = fVar30 - auVar20._0_4_;
  fVar6 = fVar30 - auVar21._0_4_;
  fVar7 = fVar30 - auVar22._0_4_;
  fVar8 = fVar30 - auVar23._0_4_;
  fVar9 = fVar30 - auVar24._0_4_;
  fVar10 = fVar30 - auVar25._0_4_;
  fVar11 = fVar30 - auVar26._0_4_;
  fVar30 = fVar30 - auVar27._0_4_;
  gauss_s1_c0[0] = expf(fVar28 * fVar78 * fVar78);
  gauss_s1_c0[1] = expf(fVar28 * fVar77 * fVar77);
  gauss_s1_c0[2] = expf(fVar28 * fVar76 * fVar76);
  gauss_s1_c0[3] = expf(fVar28 * fVar1 * fVar1);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar28 * fVar2 * fVar2);
  gauss_s1_c0[6] = expf(fVar28 * fVar3 * fVar3);
  gauss_s1_c0[7] = expf(fVar28 * fVar4 * fVar4);
  gauss_s1_c0[8] = expf(fVar28 * fVar29 * fVar29);
  gauss_s1_c1[0] = expf(fVar28 * fVar5 * fVar5);
  gauss_s1_c1[1] = expf(fVar28 * fVar6 * fVar6);
  gauss_s1_c1[2] = expf(fVar28 * fVar7 * fVar7);
  gauss_s1_c1[3] = expf(fVar28 * fVar8 * fVar8);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar28 * fVar9 * fVar9);
  gauss_s1_c1[6] = expf(fVar28 * fVar10 * fVar10);
  gauss_s1_c1[7] = expf(fVar28 * fVar11 * fVar11);
  gauss_s1_c1[8] = expf(fVar28 * fVar30 * fVar30);
  for (local_b0 = -8; local_b0 < 8; local_b0 = local_b0 + 5) {
    if ((local_b0 == -8) || (local_b0 == 7)) {
      local_b8 = gauss_s1_c1;
    }
    else {
      local_b8 = gauss_s1_c0;
    }
    iVar12 = 0;
    if (local_b0 < 0) {
      iVar12 = 8;
    }
    iVar13 = 1;
    if (local_b0 < 0) {
      iVar13 = -1;
    }
    for (local_c4 = -8; local_c4 < 8; local_c4 = local_c4 + 5) {
      if ((local_c4 == -8) || (local_c4 == 7)) {
        iimage_00 = gauss_s1_c1;
      }
      else {
        iimage_00 = gauss_s1_c0;
      }
      fVar78 = 0.0;
      fVar77 = 0.0;
      fVar76 = 0.0;
      auVar36 = ZEXT1664((undefined1  [16])0x0);
      local_e0 = 0.0;
      iVar17 = 0;
      if (local_c4 < 0) {
        iVar17 = 8;
      }
      iVar14 = 1;
      if (local_c4 < 0) {
        iVar14 = -1;
      }
      for (iVar15 = local_c4 + 8; iVar15 < local_c4 + 0x11; iVar15 = iVar15 + 1) {
        auVar52._0_4_ = (float)(iVar15 + -0xc);
        auVar52._4_12_ = auVar36._4_12_;
        auVar18 = vfmadd213ss_fma(ZEXT416((uint)fVar31),auVar52,ZEXT416((uint)(float)auVar38._0_8_))
        ;
        auVar74._8_4_ = 0x80000000;
        auVar74._0_8_ = 0x8000000080000000;
        auVar74._12_4_ = 0x80000000;
        auVar53._8_4_ = 0x3effffff;
        auVar53._0_8_ = 0x3effffff3effffff;
        auVar53._12_4_ = 0x3effffff;
        auVar19 = vpternlogd_avx512vl(auVar53,auVar18,auVar74,0xf8);
        auVar18 = vroundss_avx(auVar18,ZEXT416((uint)(auVar18._0_4_ + auVar19._0_4_)),0xb);
        iVar16 = (int)auVar18._0_4_;
        fVar1 = (float)(&((integral_image *)iimage_00)->width)[iVar17];
        local_fc = iVar12;
        for (local_100 = local_b0 + 8; auVar36 = ZEXT464(0), local_100 < local_b0 + 0x11;
            local_100 = local_100 + 1) {
          auVar18 = vfmadd213ss_fma(ZEXT416((uint)fVar31),ZEXT416((uint)(float)(local_100 + -0xc)),
                                    ZEXT416((uint)(float)auVar37._0_8_));
          auVar75._8_4_ = 0x80000000;
          auVar75._0_8_ = 0x8000000080000000;
          auVar75._12_4_ = 0x80000000;
          auVar54._8_4_ = 0x3effffff;
          auVar54._0_8_ = 0x3effffff3effffff;
          auVar54._12_4_ = 0x3effffff;
          auVar19 = vpternlogd_avx512vl(auVar54,auVar18,auVar75,0xf8);
          vroundss_avx(auVar18,ZEXT416((uint)(auVar18._0_4_ + auVar19._0_4_)),0xb);
          fVar3 = local_b8[local_fc] * fVar1;
          haarXY_precheck_boundaries
                    ((integral_image *)iimage_00,(int)fVar78,(int)fVar77,(int)fVar76,
                     (float *)CONCAT44(iVar17,iVar14),(float *)CONCAT44(iVar15,iVar16));
          fVar2 = fVar3 * 0.0;
          fVar3 = fVar3 * 0.0;
          fVar78 = fVar2 + fVar78;
          fVar77 = fVar3 + fVar77;
          auVar55._8_4_ = 0x7fffffff;
          auVar55._0_8_ = 0x7fffffff7fffffff;
          auVar55._12_4_ = 0x7fffffff;
          auVar18 = vpand_avx(ZEXT416((uint)fVar2),auVar55);
          fVar76 = auVar18._0_4_ + fVar76;
          auVar56._8_4_ = 0x7fffffff;
          auVar56._0_8_ = 0x7fffffff7fffffff;
          auVar56._12_4_ = 0x7fffffff;
          auVar18 = vpand_avx(ZEXT416((uint)fVar3),auVar56);
          local_e0 = auVar18._0_4_ + local_e0;
          local_fc = iVar13 + local_fc;
        }
        iVar17 = iVar14 + iVar17;
      }
      fVar1 = gauss_s2_arr[local_3c];
      local_3c = local_3c + 1;
      fVar78 = fVar78 * fVar1;
      fVar77 = fVar77 * fVar1;
      fVar76 = fVar76 * fVar1;
      local_e0 = local_e0 * fVar1;
      in_RSI[(long)local_34 + 5] = fVar78;
      in_RSI[(long)(local_34 + 1) + 5] = fVar77;
      in_RSI[(long)(local_34 + 2) + 5] = fVar76;
      in_RSI[(long)(local_34 + 3) + 5] = local_e0;
      auVar18 = vfmadd213ss_fma(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78),
                                ZEXT416((uint)(fVar77 * fVar77)));
      auVar18 = vfmadd213ss_fma(ZEXT416((uint)fVar76),ZEXT416((uint)fVar76),auVar18);
      auVar18 = vfmadd213ss_fma(ZEXT416((uint)local_e0),ZEXT416((uint)local_e0),auVar18);
      local_38 = auVar18._0_4_ + local_38;
      local_34 = local_34 + 4;
    }
  }
  fVar31 = sqrtf(local_38);
  for (local_13c = 0; local_13c < 0x40; local_13c = local_13c + 1) {
    in_RSI[(long)local_13c + 5] = (1.0 / fVar31) * in_RSI[(long)local_13c + 5];
  }
  return;
}

Assistant:

void get_msurf_descriptor_precompute_gauss_array(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - equal to get_msurf_descriptor_gauss_compute_once_case but with arrays insteat of case statements
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);
    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    //float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    //r(2.5*s) + r(1.5*s) == -(r(2.5*s) - r(6.5*s))

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point

    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8); l < (j + 17); ++l, gauss_index_l+=gauss_index_l_inc) {

                int sample_y = (int) roundf(ipoint_y + (l-12) * scale);
                int sample_y_sub_int_scale = sample_y-int_scale;

                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {

                    int sample_x = (int) roundf(ipoint_x + (k-12) * scale);
                    int sample_x_sub_int_scale = sample_x-int_scale;
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = 0.0f;
                    float ry = 0.0f;
                    haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &rx, &ry);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    /* Code pre optimization
    for (int i=-8; i<8; i+=5) {

        for (int j=-8; j<8; j+=5) {

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            //int xs = (int) roundf(ipoint_x + (i+0.5f) * scale);
            //int ys = (int) roundf(ipoint_y + (j+0.5f) * scale);

            int gauss_index_l = -4;
            for (int l = j-4; l < j + 5; ++l, ++gauss_index_l) {

                //Get y coords of sample point
                int sample_y = (int) roundf(ipoint_y + l * scale);
                //float ys_sub_sample_y = (float) ys-sample_y;
                //float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                //Get y coords of sample point
                int sample_y_sub_int_scale = sample_y-int_scale;

                float gauss_s1_y = -1;
                if (j == -8 ) {
                    gauss_s1_y = gauss_s1_c1[8-(gauss_index_l+4)];
                } else if (j == -3) {
                    gauss_s1_y = gauss_s1_c0[8-(gauss_index_l+4)];
                } else if (j == 2) {
                    gauss_s1_y = gauss_s1_c0[gauss_index_l+4];
                } else if (j == 7) {
                    gauss_s1_y = gauss_s1_c1[gauss_index_l+4];
                }

                int gauss_index_k = -4;
                for (int k = i-4; k < i + 5; ++k, ++gauss_index_k) {
                
                    //Get x coords of sample point
                    int sample_x = (int) roundf(ipoint_x + k * scale);
                    //float xs_sub_sample_x = (float) xs-sample_x;
                    //float xs_sub_sample_x_squared = xs_sub_sample_x*xs_sub_sample_x;

                    //Get x coords of sample point
                    int sample_x_sub_int_scale = sample_x-int_scale;

                    float gauss_s1_x = -1;
                    if (i == -8 ) {
                        gauss_s1_x = gauss_s1_c1[8-(gauss_index_k+4)];
                    } else if (i == -3) {
                        gauss_s1_x = gauss_s1_c0[8-(gauss_index_k+4)];
                    } else if (i == 2) {
                        gauss_s1_x = gauss_s1_c0[gauss_index_k+4];
                    } else if (i == 7) {
                        gauss_s1_x = gauss_s1_c1[gauss_index_k+4];
                    }

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = 0.0f;
                    float ry = 0.0f;
                    haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &rx, &ry);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            //float gauss_s2 = expf(g2_factor * (cx_squared + cy_squared)); 
            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            //float gauss_s2 = gauss_s2_precomputed[gauss_s2_index++];
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }
    */
    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}